

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O3

bool __thiscall inja::Parser::parse_expression_datum(Parser *this,Template *tmpl)

{
  Token *this_00;
  pointer pBVar1;
  const_pointer pcVar2;
  undefined4 uVar3;
  Template *tmpl_00;
  char cVar4;
  bool bVar5;
  int iVar6;
  long *plVar7;
  undefined8 *puVar8;
  FunctionData *pFVar9;
  long *plVar10;
  size_type *psVar11;
  Op op;
  size_t __n;
  char *pcVar12;
  char *first;
  long lVar13;
  pointer pcVar14;
  long lVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  uint num_args;
  size_t __n_00;
  string_view name;
  string_view name_00;
  undefined1 local_110 [8];
  json_value jStack_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  string local_f0;
  Token *local_d0;
  Lexer *local_c8;
  ulong local_c0;
  Template *local_b8;
  char *local_b0;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  basic_string_view<char,_std::char_traits<char>_> *local_88;
  char *local_80;
  string local_78;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  
  this_00 = &this->m_tok;
  local_88 = &(this->m_tok).text;
  local_c8 = &this->m_lexer;
  local_d0 = &this->m_peek_tok;
  local_80 = (char *)0x0;
  lVar13 = 0;
  lVar15 = 0;
  local_b8 = tmpl;
  do {
    switch(this_00->kind) {
    case Id:
      cVar4 = this->m_have_peek_tok;
      if ((bool)cVar4 == false) {
        Lexer::scan((Token *)local_110,local_c8);
        (local_d0->text).size_ = local_100._M_allocated_capacity;
        *(undefined1 (*) [8])local_d0 = local_110;
        (local_d0->text).data_ = (const_pointer)jStack_108;
        this->m_have_peek_tok = true;
        cVar4 = '\x01';
      }
      local_b0 = (this->m_tok).text.data_;
      local_c0 = (this->m_tok).text.size_;
      if ((this->m_peek_tok).kind != LeftParen) {
        if (local_c0 == 0) {
LAB_001ad9b1:
          local_f0._M_dataplus._M_p._0_1_ = 3;
          local_110 = (undefined1  [8])
                      (CONCAT44(local_110._4_4_,(uint)(this->m_config->notation == Pointer)) | 2);
          std::vector<inja::Bytecode,std::allocator<inja::Bytecode>>::
          emplace_back<inja::Bytecode::Op,nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>&,inja::Bytecode::Flag>
                    ((vector<inja::Bytecode,std::allocator<inja::Bytecode>> *)local_b8,
                     (Op *)&local_f0,local_88,(Flag *)local_110);
        }
        else {
          __n_00 = 4;
          if (local_c0 < 4) {
            __n_00 = local_c0;
          }
          iVar6 = bcmp(local_b0,"true",__n_00);
          if ((local_c0 != 4) || (iVar6 != 0)) {
            __n = 5;
            if (local_c0 < 5) {
              __n = local_c0;
            }
            iVar6 = bcmp(local_b0,"false",__n);
            if (((local_c0 != 5) || (iVar6 != 0)) &&
               ((iVar6 = bcmp(local_b0,"null",__n_00), local_c0 != 4 || (iVar6 != 0))))
            goto LAB_001ad9b1;
          }
          first = local_b0;
          if (lVar13 != 0 || lVar15 != 0) break;
LAB_001ad8ef:
          pcVar12 = local_88->data_;
LAB_001ad90a:
          local_78._M_dataplus._M_p._0_1_ = 3;
          nlohmann::detail::input_adapter::input_adapter<const_char_*,_0>
                    ((input_adapter *)&local_f0,first,pcVar12 + (this->m_tok).text.size_);
          local_48 = (code *)0x0;
          uStack_40 = 0;
          local_58._M_unused._M_object = (void *)0x0;
          local_58._8_8_ = 0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)local_110,(input_adapter *)&local_f0,(parser_callback_t *)&local_58,true);
          local_a8 = (long *)CONCAT44(local_a8._4_4_,1);
          std::vector<inja::Bytecode,std::allocator<inja::Bytecode>>::
          emplace_back<inja::Bytecode::Op,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,inja::Bytecode::Flag>
                    ((vector<inja::Bytecode,std::allocator<inja::Bytecode>> *)local_b8,
                     (Op *)&local_78,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_110,(Flag *)&local_a8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)local_110);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::json_value::destroy((json_value *)(local_110 + 8),(value_t)local_110[0]);
          if (local_48 != (code *)0x0) {
            (*local_48)(&local_58,&local_58,__destroy_functor);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._M_string_length);
          }
        }
        goto LAB_001ad9e0;
      }
      if (cVar4 == '\0') {
        Lexer::scan((Token *)local_110,local_c8);
        (this->m_tok).text.size_ = local_100._M_allocated_capacity;
        *(undefined1 (*) [8])this_00 = local_110;
        (this->m_tok).text.data_ = (const_pointer)jStack_108;
        if ((this->m_have_peek_tok & 1U) == 0) goto LAB_001adc82;
        (this->m_tok).text.size_ = (local_d0->text).size_;
        uVar3 = *(undefined4 *)&local_d0->field_0x4;
        pcVar2 = (local_d0->text).data_;
        this_00->kind = local_d0->kind;
        *(undefined4 *)&this_00->field_0x4 = uVar3;
        (this->m_tok).text.data_ = pcVar2;
        this->m_have_peek_tok = false;
      }
      else {
        (this->m_tok).text.size_ = (local_d0->text).size_;
        uVar3 = *(undefined4 *)&local_d0->field_0x4;
        pcVar2 = (local_d0->text).data_;
        this_00->kind = local_d0->kind;
        *(undefined4 *)&this_00->field_0x4 = uVar3;
        (this->m_tok).text.data_ = pcVar2;
        this->m_have_peek_tok = false;
LAB_001adc82:
        Lexer::scan((Token *)local_110,local_c8);
        (this->m_tok).text.size_ = local_100._M_allocated_capacity;
        *(undefined1 (*) [8])this_00 = local_110;
        (this->m_tok).text.data_ = (const_pointer)jStack_108;
      }
      paVar16 = &local_f0.field_2;
      pcVar14 = local_110 + 0x10;
      if (this_00->kind != RightParen) {
        num_args = 1;
        goto LAB_001adcd7;
      }
      if (this->m_have_peek_tok == true) {
        (this->m_tok).text.size_ = (local_d0->text).size_;
        uVar3 = *(undefined4 *)&local_d0->field_0x4;
        pcVar2 = (local_d0->text).data_;
        this_00->kind = local_d0->kind;
        *(undefined4 *)&this_00->field_0x4 = uVar3;
        (this->m_tok).text.data_ = pcVar2;
        this->m_have_peek_tok = false;
      }
      else {
        Lexer::scan((Token *)local_110,local_c8);
        (this->m_tok).text.size_ = local_100._M_allocated_capacity;
        *(undefined1 (*) [8])this_00 = local_110;
        (this->m_tok).text.data_ = (const_pointer)jStack_108;
      }
      num_args = 0;
      goto LAB_001ae041;
    case Number:
    case String:
      if (lVar13 == 0 && lVar15 == 0) {
        pcVar12 = local_88->data_;
        first = pcVar12;
        goto LAB_001ad90a;
      }
      break;
    case Comma:
    case Colon:
      if (lVar13 == 0 && lVar15 == 0) {
        local_110 = (undefined1  [8])(local_110 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"parser_error","");
        Token::describe_abi_cxx11_(&local_78,this_00);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x4854ae);
        plVar10 = plVar7 + 2;
        if ((long *)*plVar7 == plVar10) {
          local_98 = *plVar10;
          lStack_90 = plVar7[3];
          local_a8 = &local_98;
        }
        else {
          local_98 = *plVar10;
          local_a8 = (long *)*plVar7;
        }
        local_a0 = plVar7[1];
        *plVar7 = (long)plVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_a8);
        psVar11 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_f0.field_2._M_allocated_capacity = *psVar11;
          local_f0.field_2._8_8_ = plVar7[3];
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        }
        else {
          local_f0.field_2._M_allocated_capacity = *psVar11;
          local_f0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_f0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        inja_throw((string *)local_110,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if (local_a8 != &local_98) {
          operator_delete(local_a8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_) !=
            &local_78.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_))
          ;
        }
        if (local_110 != (undefined1  [8])(local_110 + 0x10)) {
          operator_delete((void *)local_110);
        }
        lVar13 = 0;
        lVar15 = 0;
      }
      break;
    case LeftParen:
      if (this->m_have_peek_tok == true) {
        (this->m_tok).text.size_ = (local_d0->text).size_;
        uVar3 = *(undefined4 *)&local_d0->field_0x4;
        pcVar2 = (local_d0->text).data_;
        this_00->kind = local_d0->kind;
        *(undefined4 *)&this_00->field_0x4 = uVar3;
        (this->m_tok).text.data_ = pcVar2;
        this->m_have_peek_tok = false;
      }
      else {
        Lexer::scan((Token *)local_110,local_c8);
        (this->m_tok).text.size_ = local_100._M_allocated_capacity;
        *(undefined1 (*) [8])this_00 = local_110;
        (this->m_tok).text.data_ = (const_pointer)jStack_108;
      }
      bVar5 = parse_expression(this,local_b8);
      if (!bVar5) {
        return false;
      }
      if (this_00->kind != RightParen) {
        local_110 = (undefined1  [8])(local_110 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"parser_error","");
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"unmatched \'(\'","");
        inja_throw((string *)local_110,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if (local_110 != (undefined1  [8])(local_110 + 0x10)) {
          operator_delete((void *)local_110);
        }
      }
LAB_001ad9e0:
      if (this->m_have_peek_tok == true) {
        (this->m_tok).text.size_ = (local_d0->text).size_;
        uVar3 = *(undefined4 *)&local_d0->field_0x4;
        pcVar2 = (local_d0->text).data_;
        this_00->kind = local_d0->kind;
        *(undefined4 *)&this_00->field_0x4 = uVar3;
        (this->m_tok).text.data_ = pcVar2;
        this->m_have_peek_tok = false;
        return true;
      }
      Lexer::scan((Token *)local_110,local_c8);
      (this->m_tok).text.size_ = local_100._M_allocated_capacity;
      *(undefined1 (*) [8])this_00 = local_110;
      (this->m_tok).text.data_ = (const_pointer)jStack_108;
      return true;
    default:
      pcVar14 = local_110 + 0x10;
      if (lVar13 != 0) {
        local_110 = (undefined1  [8])pcVar14;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"parser_error","");
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"unmatched \'{\'","");
        inja_throw((string *)local_110,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if (local_110 != (undefined1  [8])pcVar14) {
          operator_delete((void *)local_110);
        }
      }
      if (lVar15 == 0) {
        return false;
      }
      local_110 = (undefined1  [8])pcVar14;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"parser_error","");
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"unmatched \'[\'","");
      inja_throw((string *)local_110,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if (local_110 == (undefined1  [8])pcVar14) {
        return false;
      }
      operator_delete((void *)local_110);
      return false;
    case LeftBracket:
      if (lVar13 == 0 && lVar15 == 0) {
        local_80 = local_88->data_;
      }
      lVar15 = lVar15 + 1;
      break;
    case RightBracket:
      if (lVar15 == 0) {
        local_110 = (undefined1  [8])(local_110 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"parser_error","");
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"unexpected \']\'","");
        inja_throw((string *)local_110,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if (local_110 != (undefined1  [8])(local_110 + 0x10)) {
          operator_delete((void *)local_110);
        }
        lVar15 = -1;
      }
      else {
        lVar15 = lVar15 + -1;
LAB_001ad6b2:
        first = local_80;
        if (lVar13 == 0 && lVar15 == 0) goto LAB_001ad8ef;
      }
      break;
    case LeftBrace:
      if (lVar13 == 0 && lVar15 == 0) {
        local_80 = local_88->data_;
      }
      lVar13 = lVar13 + 1;
      break;
    case RightBrace:
      if (lVar13 != 0) {
        lVar13 = lVar13 + -1;
        goto LAB_001ad6b2;
      }
      local_110 = (undefined1  [8])(local_110 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"parser_error","");
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"unexpected \'}\'","");
      inja_throw((string *)local_110,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if (local_110 != (undefined1  [8])(local_110 + 0x10)) {
        operator_delete((void *)local_110);
      }
      lVar13 = -1;
    }
    if (this->m_have_peek_tok == true) {
      (this->m_tok).text.size_ = (local_d0->text).size_;
      uVar3 = *(undefined4 *)&local_d0->field_0x4;
      pcVar2 = (local_d0->text).data_;
      this_00->kind = local_d0->kind;
      *(undefined4 *)&this_00->field_0x4 = uVar3;
      (this->m_tok).text.data_ = pcVar2;
      this->m_have_peek_tok = false;
    }
    else {
      Lexer::scan((Token *)local_110,local_c8);
      (this->m_tok).text.size_ = local_100._M_allocated_capacity;
      *(undefined1 (*) [8])this_00 = local_110;
      (this->m_tok).text.data_ = (const_pointer)jStack_108;
    }
  } while( true );
LAB_001adcd7:
  bVar5 = parse_expression(this,local_b8);
  if (!bVar5) {
    local_110 = (undefined1  [8])pcVar14;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"parser_error","");
    Token::describe_abi_cxx11_(&local_78,this_00);
    puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x485454);
    local_a8 = &local_98;
    plVar7 = puVar8 + 2;
    if ((long *)*puVar8 == plVar7) {
      local_98 = *plVar7;
      lStack_90 = puVar8[3];
    }
    else {
      local_98 = *plVar7;
      local_a8 = (long *)*puVar8;
    }
    local_a0 = puVar8[1];
    *puVar8 = plVar7;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_a8);
    psVar11 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_f0.field_2._M_allocated_capacity = *psVar11;
      local_f0.field_2._8_8_ = puVar8[3];
      local_f0._M_dataplus._M_p = (pointer)paVar16;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar11;
      local_f0._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_f0._M_string_length = puVar8[1];
    *puVar8 = psVar11;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    inja_throw((string *)local_110,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar16) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_) !=
        &local_78.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_));
    }
    if (local_110 != (undefined1  [8])pcVar14) {
      operator_delete((void *)local_110);
    }
  }
  if (this_00->kind != Comma) {
    if (this_00->kind == RightParen) {
      if (this->m_have_peek_tok == true) {
        (this->m_tok).text.size_ = (local_d0->text).size_;
        uVar3 = *(undefined4 *)&local_d0->field_0x4;
        pcVar2 = (local_d0->text).data_;
        this_00->kind = local_d0->kind;
        *(undefined4 *)&this_00->field_0x4 = uVar3;
        (this->m_tok).text.data_ = pcVar2;
        this->m_have_peek_tok = false;
      }
      else {
        Lexer::scan((Token *)local_110,local_c8);
        (this->m_tok).text.size_ = local_100._M_allocated_capacity;
        *(undefined1 (*) [8])this_00 = local_110;
        (this->m_tok).text.data_ = (const_pointer)jStack_108;
      }
LAB_001ae041:
      name.size_ = local_c0;
      name.data_ = local_b0;
      pFVar9 = FunctionStorage::get(&this->m_static->functions,name,num_args);
      tmpl_00 = local_b8;
      if ((pFVar9 == (FunctionData *)0x0) || (op = pFVar9->op, op == Nop)) {
        name_00.size_ = local_c0;
        name_00.data_ = local_b0;
        append_callback(this,local_b8,name_00,num_args);
      }
      else {
        if (op == Default) {
          pBVar1 = (local_b8->bytecodes).
                   super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          std::swap<inja::Bytecode>(pBVar1 + -1,pBVar1 + -2);
          op = Default;
        }
        append_function(this,tmpl_00,op,num_args);
      }
      return true;
    }
    local_110 = (undefined1  [8])pcVar14;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"parser_error","");
    Token::describe_abi_cxx11_(&local_78,this_00);
    puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x487ef6);
    local_a8 = &local_98;
    plVar7 = puVar8 + 2;
    if ((long *)*puVar8 == plVar7) {
      local_98 = *plVar7;
      lStack_90 = puVar8[3];
    }
    else {
      local_98 = *plVar7;
      local_a8 = (long *)*puVar8;
    }
    local_a0 = puVar8[1];
    *puVar8 = plVar7;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_a8);
    psVar11 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_f0.field_2._M_allocated_capacity = *psVar11;
      local_f0.field_2._8_8_ = puVar8[3];
      local_f0._M_dataplus._M_p = (pointer)paVar16;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar11;
      local_f0._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_f0._M_string_length = puVar8[1];
    *puVar8 = psVar11;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    inja_throw((string *)local_110,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar16) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_) !=
        &local_78.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_));
    }
    if (local_110 != (undefined1  [8])pcVar14) {
      operator_delete((void *)local_110);
    }
  }
  if (this->m_have_peek_tok == true) {
    (this->m_tok).text.size_ = (local_d0->text).size_;
    uVar3 = *(undefined4 *)&local_d0->field_0x4;
    pcVar2 = (local_d0->text).data_;
    this_00->kind = local_d0->kind;
    *(undefined4 *)&this_00->field_0x4 = uVar3;
    (this->m_tok).text.data_ = pcVar2;
    this->m_have_peek_tok = false;
  }
  else {
    Lexer::scan((Token *)local_110,local_c8);
    (this->m_tok).text.size_ = local_100._M_allocated_capacity;
    *(undefined1 (*) [8])this_00 = local_110;
    (this->m_tok).text.data_ = (const_pointer)jStack_108;
  }
  num_args = num_args + 1;
  goto LAB_001adcd7;
}

Assistant:

bool parse_expression_datum(Template& tmpl) {
		nonstd::string_view json_first;
		size_t bracket_level = 0;
		size_t brace_level = 0;

		for (;;) {
			switch (m_tok.kind) {
				case Token::Kind::LeftParen: {
					get_next_token();
					if (!parse_expression(tmpl)) return false;
					if (m_tok.kind != Token::Kind::RightParen) {
						inja_throw("parser_error", "unmatched '('");
					}
					get_next_token();
					return true;
				}
				case Token::Kind::Id:
					get_peek_token();
					if (m_peek_tok.kind == Token::Kind::LeftParen) {
						// function call, parse arguments
						Token func_token = m_tok;
						get_next_token();  // id
						get_next_token();  // leftParen
						unsigned int num_args = 0;
						if (m_tok.kind == Token::Kind::RightParen) {
							// no args
							get_next_token();
						} else {
							for (;;) {
								if (!parse_expression(tmpl)) {
									inja_throw("parser_error", "expected expression, got '" + m_tok.describe() + "'");
								}
								num_args += 1;
								if (m_tok.kind == Token::Kind::RightParen) {
									get_next_token();
									break;
								}
								if (m_tok.kind != Token::Kind::Comma) {
									inja_throw("parser_error", "expected ')' or ',', got '" + m_tok.describe() + "'");
								}
								get_next_token();
							}
						}

						auto op = m_static.functions.find_builtin(func_token.text, num_args);

						if (op != Bytecode::Op::Nop) {
							// swap arguments for default(); see comment in RenderTo()
							if (op == Bytecode::Op::Default)
								std::swap(tmpl.bytecodes.back(), *(tmpl.bytecodes.rbegin() + 1));
							append_function(tmpl, op, num_args);
							return true;
						} else {
							append_callback(tmpl, func_token.text, num_args);
							return true;
						}
					} else if (m_tok.text == "true" || m_tok.text == "false" || m_tok.text == "null") {
						// true, false, null are json literals
						if (brace_level == 0 && bracket_level == 0) {
							json_first = m_tok.text;
							goto returnJson;
						}
						break;
					} else {
						// normal literal (json read)
						tmpl.bytecodes.emplace_back(Bytecode::Op::Push, m_tok.text,
													m_config.notation == ElementNotation::Pointer
														? Bytecode::Flag::ValueLookupPointer
														: Bytecode::Flag::ValueLookupDot);
						get_next_token();
						return true;
					}
				// json passthrough
				case Token::Kind::Number:
				case Token::Kind::String:
					if (brace_level == 0 && bracket_level == 0) {
						json_first = m_tok.text;
						goto returnJson;
					}
					break;
				case Token::Kind::Comma:
				case Token::Kind::Colon:
					if (brace_level == 0 && bracket_level == 0) {
						inja_throw("parser_error", "unexpected token '" + m_tok.describe() + "'");
					}
					break;
				case Token::Kind::LeftBracket:
					if (brace_level == 0 && bracket_level == 0) {
						json_first = m_tok.text;
					}
					bracket_level += 1;
					break;
				case Token::Kind::LeftBrace:
					if (brace_level == 0 && bracket_level == 0) {
						json_first = m_tok.text;
					}
					brace_level += 1;
					break;
				case Token::Kind::RightBracket:
					if (bracket_level == 0) {
						inja_throw("parser_error", "unexpected ']'");
					}
					--bracket_level;
					if (brace_level == 0 && bracket_level == 0) goto returnJson;
					break;
				case Token::Kind::RightBrace:
					if (brace_level == 0) {
						inja_throw("parser_error", "unexpected '}'");
					}
					--brace_level;
					if (brace_level == 0 && bracket_level == 0) goto returnJson;
					break;
				default:
					if (brace_level != 0) {
						inja_throw("parser_error", "unmatched '{'");
					}
					if (bracket_level != 0) {
						inja_throw("parser_error", "unmatched '['");
					}
					return false;
			}

			get_next_token();
		}

	returnJson:
		// bridge across all intermediate tokens
		nonstd::string_view json_text(json_first.data(), m_tok.text.data() - json_first.data() + m_tok.text.size());
		tmpl.bytecodes.emplace_back(Bytecode::Op::Push, json::parse(json_text), Bytecode::Flag::ValueImmediate);
		get_next_token();
		return true;
	}